

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O1

void __thiscall
Lib::UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_>::~UniquePersistentIterator
          (UniquePersistentIterator<Lib::VirtualIterator<Kernel::Term_*>_> *this)

{
  Term *pTVar1;
  Term *pTVar2;
  List<Kernel::Term_*> *current;
  
  (this->super_IteratorCore<Kernel::Term_*>)._vptr_IteratorCore =
       (_func_int **)&PTR__UniquePersistentIterator_00b67238;
  pTVar2 = (Term *)this->_items;
  while (pTVar1 = pTVar2, pTVar1 != (Term *)0x0) {
    pTVar2 = *(Term **)&pTVar1->_functor;
    if (pTVar1 != (Term *)0x0) {
      pTVar1->_vptr_Term = (_func_int **)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pTVar1;
    }
  }
  (this->super_IteratorCore<Kernel::Term_*>)._vptr_IteratorCore =
       (_func_int **)&PTR__IteratorCore_00b56ff0;
  operator_delete(this,0x20);
  return;
}

Assistant:

~UniquePersistentIterator()
  {
    if(_items) {
      ItemList::destroy(_items);
    }
  }